

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U>::insert
          (SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U> *this,
          TypeModulePair *key,TypeBase **value)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  Node *this_00;
  TypeModulePair local_48;
  
  local_48.typeName.begin = (char *)0x0;
  local_48.typeName.end = (char *)0x0;
  local_48.importModule = (ModuleData *)0x0;
  bVar1 = TypeModulePair::operator!=(key,&local_48);
  if (bVar1) {
    uVar4 = this->bucketCount;
    if (uVar4 <= (this->count >> 2) + this->count) {
      rehash(this);
      uVar4 = this->bucketCount;
    }
    uVar2 = TypeModulePairHasher::operator()((TypeModulePairHasher *)&local_48,key);
    for (iVar3 = 1; iVar3 - 1U < this->bucketCount; iVar3 = iVar3 + 1) {
      uVar2 = uVar2 & uVar4 - 1;
      this_00 = this->data + uVar2;
      local_48.typeName.begin = (char *)0x0;
      local_48.typeName.end = (char *)0x0;
      local_48.importModule = (ModuleData *)0x0;
      bVar1 = TypeModulePair::operator==(&this_00->key,&local_48);
      if (bVar1) {
        (this_00->key).importModule = key->importModule;
        pcVar5 = (key->typeName).end;
        (this_00->key).typeName.begin = (key->typeName).begin;
        (this_00->key).typeName.end = pcVar5;
        this_00->value = *value;
        this->count = this->count + 1;
        return;
      }
      bVar1 = TypeModulePair::operator==(&this_00->key,key);
      if (bVar1) {
        this_00->value = *value;
        return;
      }
      uVar2 = uVar2 + iVar3;
    }
    pcVar5 = "!\"couldn\'t insert node\"";
    uVar4 = 0x5b;
  }
  else {
    pcVar5 = "key != Key()";
    uVar4 = 0x3b;
  }
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                ,uVar4,
                "void SmallDenseMap<TypeModulePair, TypeBase *, TypeModulePairHasher, 32>::insert(const Key &, const Value &) [Key = TypeModulePair, Value = TypeBase *, Hasher = TypeModulePairHasher, N = 32]"
               );
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
			{
				item.key = key;
				item.value = value;

				count++;
				return;
			}

			if(item.key == key)
			{
				item.value = value;
				return;
			}

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}